

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.c
# Opt level: O3

BoolExpr * BO_or(List *ls)

{
  bool bVar1;
  BoolExpr *pBVar2;
  BoolExpr *pBVar3;
  ListStruct *ls_00;
  BoolExpr *pBVar4;
  
  pBVar2 = (BoolExpr *)malloc(0x18);
  pBVar2->type = E_OR;
  pBVar2->subexpr = (BoolExprStruct *)0x0;
  pBVar2->next = (BoolExprStruct *)0x0;
  ls_00 = ls->cdr;
  if (ls_00 != (ListStruct *)0x0) {
    pBVar4 = (BoolExpr *)0x0;
    bVar1 = false;
    do {
      pBVar3 = make_boolean_expr(ls_00);
      if (pBVar3->type == E_FALSE) {
        bVar1 = true;
      }
      else {
        if (pBVar3->type == E_TRUE) {
          return &true_bool_expr;
        }
        pBVar3->next = pBVar4;
        pBVar2->subexpr = pBVar3;
        pBVar4 = pBVar3;
      }
      ls_00 = ls_00->cdr;
    } while (ls_00 != (ListStruct *)0x0);
    if (pBVar4 != (BoolExpr *)0x0) {
      if (pBVar4->next != (BoolExprStruct *)0x0) {
        return pBVar2;
      }
      return pBVar4;
    }
    if (bVar1) goto LAB_00108c61;
  }
  parse_error((List *)0x0,"or takes arguments!\n");
LAB_00108c61:
  return &false_bool_expr;
}

Assistant:

static BoolExpr *
BO_or (const List *ls)
{
  BOOL hit_false = FALSE;
  BoolExpr *subexpr, *ret;

  ret = create_bool_expr (E_OR, NULL);
  while ((ls = ls->cdr))
    {
      subexpr = make_boolean_expr (ls);
      if (subexpr->type == E_TRUE)
	return &true_bool_expr;
      if (subexpr->type == E_FALSE)  /* No sense adding in FALSE statements*/
	hit_false = TRUE;
      else
	{
	  subexpr->next = ret->subexpr;
	  ret->subexpr = subexpr;
	}
    }
  if (ret->subexpr == NULL)
    {
      if (hit_false)   /* If we hit nothing but FALSE's return FALSE */
	return &false_bool_expr;
      parse_error(ls, "or takes arguments!\n");
      return &false_bool_expr;   /* Default = FALSE */
    }
  
  if (ret->subexpr->next == NULL) /* (or a) == a */
    return ret->subexpr;
  
  return ret;
}